

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O3

bool pd::prepareWord2vecInput
               (string *dir_name,string *out_filename,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *dict)

{
  error_code *peVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  directory_iterator dVar4;
  char cVar5;
  int iVar6;
  istream *piVar7;
  const_iterator cVar8;
  ostream *poVar9;
  bool bVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  undefined8 *puVar11;
  long local_4b0;
  ofstream of;
  ios_base local_3b8 [264];
  undefined1 local_2b0 [8];
  ifstream fi;
  dir_itr_imp local_2a0 [16];
  byte abStack_290 [488];
  size_type *local_a8;
  path targetDir;
  undefined1 local_80 [8];
  string line;
  directory_iterator it;
  directory_iterator eod;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_48;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_40;
  directory_iterator local_38;
  
  local_a8 = &targetDir.m_pathname._M_string_length;
  pcVar2 = (dir_name->_M_dataplus)._M_p;
  targetDir.m_pathname.field_2._8_8_ = dict;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + dir_name->_M_string_length);
  boost::filesystem::directory_iterator::directory_iterator
            ((directory_iterator *)((long)&line.field_2 + 8),(path *)&local_a8,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  std::ofstream::ofstream((ostream *)&local_4b0,(string *)out_filename,_S_out);
  local_2b0 = (undefined1  [8])line.field_2._8_8_;
  if (line.field_2._8_8_ != 0) {
    LOCK();
    *(int *)line.field_2._8_8_ = *(int *)line.field_2._8_8_ + 1;
    UNLOCK();
  }
  _fi = it.m_imp.px;
  if (it.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
    UNLOCK();
  }
  eod.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
                 (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)line.field_2._8_8_;
  if (line.field_2._8_8_ != 0) {
    LOCK();
    *(int *)line.field_2._8_8_ = *(int *)line.field_2._8_8_ + 1;
    UNLOCK();
  }
  local_48 = it.m_imp.px;
  if (it.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&fi);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)local_2b0);
  local_2b0 = (undefined1  [8])eod.m_imp.px;
  if (eod.m_imp.px == (dir_itr_imp *)0x0) {
    local_38.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  }
  else {
    LOCK();
    *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
    UNLOCK();
    local_38 = (directory_iterator)(directory_iterator)eod.m_imp.px;
    if (eod.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
      UNLOCK();
    }
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)local_2b0);
  local_2b0 = (undefined1  [8])local_48.px;
  if (local_48.px == (dir_itr_imp *)0x0) {
    local_40.px = (dir_itr_imp *)0x0;
  }
  else {
    LOCK();
    *(int *)local_48.px = *(int *)local_48.px + 1;
    UNLOCK();
    local_40.px = local_48.px;
    if (local_48.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_48.px = *(int *)local_48.px + 1;
      UNLOCK();
    }
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)local_2b0);
  while (dVar4.m_imp.px = local_38.m_imp.px,
        local_38.m_imp.px != (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_40.px) {
    if ((local_38.m_imp.px == (dir_itr_imp *)0x0) ||
       (*(long *)((long)local_38.m_imp.px + 0x38) == 0)) {
      if ((local_40.px == (dir_itr_imp *)0x0) || (*(long *)(local_40.px + 0x38) == 0)) break;
      if ((local_38.m_imp.px == (dir_itr_imp *)0x0) ||
         (*(long *)((long)local_38.m_imp.px + 0x38) == 0)) {
        __assert_fail("(!is_end())&&(\"attempt to dereference end directory iterator\")",
                      "/usr/include/boost/filesystem/directory.hpp",0x140,
                      "boost::iterator_facade<directory_iterator, directory_entry, boost::single_pass_traversal_tag>::reference boost::filesystem::directory_iterator::dereference() const"
                     );
      }
    }
    peVar1 = (error_code *)((long)local_38.m_imp.px + 8);
    boost::filesystem::detail::status((path *)local_2b0,peVar1);
    if (local_2b0._0_4_ == 2) {
      boost::filesystem::path::extension();
      iVar6 = boost::filesystem::path::compare((path *)local_2b0,"swp");
      if (local_2b0 != (undefined1  [8])local_2a0) {
        operator_delete((void *)local_2b0);
      }
      if (iVar6 != 0) {
        std::ifstream::ifstream(local_2b0,(string *)peVar1,_S_in);
        if ((abStack_290[*(long *)((long)local_2b0 + -0x18)] & 5) == 0) {
          local_80 = (undefined1  [8])&line._M_string_length;
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length._0_1_ = 0;
          while( true ) {
            cVar5 = std::ios::widen((char)*(undefined8 *)((long)local_2b0 + -0x18) +
                                    (char)(istream *)local_2b0);
            piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_2b0,(string *)local_80,cVar5);
            if ((((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) ||
               (line._M_dataplus._M_p == (pointer)0x0)) break;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_4b0,(char *)local_80,(long)line._M_dataplus._M_p);
            cVar8 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)targetDir.m_pathname.field_2._8_8_,(key_type *)local_80);
            if (cVar8.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              puVar3 = *(undefined8 **)
                        ((long)cVar8.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
                               ._M_cur + 0x30);
              for (puVar11 = *(undefined8 **)
                              ((long)cVar8.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
                                     ._M_cur + 0x28); puVar11 != puVar3; puVar11 = puVar11 + 4) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b0," ",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_4b0,(char *)*puVar11,puVar11[1]);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b0," ",1);
            }
          }
          if (local_80 != (undefined1  [8])&line._M_string_length) {
            operator_delete((void *)local_80);
          }
          std::ifstream::~ifstream((istream *)local_2b0);
          goto LAB_0010f02c;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,*(char **)((long)dVar4.m_imp.px + 8),
                            *(long *)((long)dVar4.m_imp.px + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"doesn\'t exist",0xd);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::ifstream::~ifstream(local_2b0);
        boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
        boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                  (&local_38.m_imp);
        bVar10 = false;
        goto LAB_0010f07b;
      }
    }
    else {
LAB_0010f02c:
      cVar5 = (char)(ostream *)&local_4b0;
      std::ios::widen((char)*(undefined8 *)(local_4b0 + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
    }
    boost::filesystem::detail::directory_iterator_increment(&local_38,(error_code *)0x0);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_38.m_imp);
  bVar10 = true;
LAB_0010f07b:
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_48);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
  local_4b0 = _VTT;
  *(undefined8 *)((long)&local_4b0 + *(long *)(_VTT + -0x18)) = _sentry;
  std::filebuf::~filebuf((filebuf *)&of);
  std::ios_base::~ios_base(local_3b8);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)((long)&line.field_2 + 8));
  if (local_a8 != &targetDir.m_pathname._M_string_length) {
    operator_delete(local_a8);
  }
  return bVar10;
}

Assistant:

bool prepareWord2vecInput(const std::string& dir_name, const std::string& out_filename, const std::unordered_map<std::string, std::vector<std::string>>& dict)
    {
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        std::ofstream of(out_filename);
        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                //std::cout << p.string() << std::endl;
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                while (std::getline(fi, line) and !line.empty())
                {
                    of << line;
                    std::unordered_map<std::string, std::vector<std::string>>::const_iterator it = dict.find(line);
                    if (it == dict.end())
                        continue;
                    
                    for (const auto& s: it->second)
                    {
                        of << " " << s;
                    }
                    of << " ";
                }                
            }
            of << std::endl; 
        }
        return true;
    }